

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  undefined8 uVar1;
  ostream *poVar2;
  long lVar3;
  stringstream local_1c8 [8];
  stringstream ss;
  char local_31;
  
  ss._384_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c8);
  if (this != (JSONWriter *)0x0) {
    lVar3 = 0;
    do {
      local_31 = *(char *)(lVar3 + value._M_len);
      if (local_31 == '\\') {
        local_31 = '\\';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&ss.field_0x8,&local_31,1);
        local_31 = '\\';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss.field_0x8,&local_31,1);
      }
      lVar3 = lVar3 + 1;
    } while (this != (JSONWriter *)lVar3);
  }
  uVar1 = ss._384_8_;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::ios_base::~ios_base((ios_base *)&ss.field_0x78);
  return (string *)uVar1;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }